

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O1

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintSam(ConvertToolPrivate *this,BamAlignment *a)

{
  ostream *this_00;
  byte bVar1;
  int iVar2;
  pointer pRVar3;
  pointer pCVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  char cVar8;
  ostream *poVar9;
  long lVar10;
  size_t sVar11;
  BadDataException *pBVar12;
  int iVar13;
  size_type sVar14;
  char *pcVar15;
  string *psVar16;
  ulong uVar17;
  const_iterator cigarIter;
  pointer pCVar18;
  string tagName;
  string local_a8;
  string local_88;
  ConvertToolPrivate *local_68;
  string *local_60;
  BamAlignment *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->m_out;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,(a->Name)._M_dataplus._M_p,(a->Name)._M_string_length);
  local_88._M_dataplus._M_p._0_1_ = 9;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_88,1);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  local_88._M_dataplus._M_p._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_88,1);
  iVar2 = a->RefID;
  lVar10 = (long)iVar2;
  local_68 = this;
  if ((lVar10 < 0) ||
     (pRVar3 = (this->m_references).
               super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
               super__Vector_impl_data._M_start,
     iVar13 = (int)((ulong)((long)(this->m_references).
                                  super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3),
     SBORROW4(iVar2,iVar13 * -0x33333333) == iVar2 + iVar13 * 0x33333333 < 0)) {
    pcVar15 = "*\t";
    lVar10 = 2;
    poVar9 = this_00;
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (this_00,pRVar3[lVar10].RefName._M_dataplus._M_p,
                        pRVar3[lVar10].RefName._M_string_length);
    pcVar15 = (char *)&local_88;
    local_88._M_dataplus._M_p._0_1_ = 9;
    lVar10 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,lVar10);
  poVar9 = (ostream *)std::ostream::operator<<(this_00,a->Position + 1);
  local_88._M_dataplus._M_p._0_1_ = 9;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_88,1);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  local_88._M_dataplus._M_p._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_88,1);
  pCVar18 = (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar18 == pCVar4) {
    pcVar15 = "*\t";
    lVar10 = 2;
  }
  else {
    do {
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      local_88._M_dataplus._M_p._0_1_ = pCVar18->Type;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_88,1);
      pCVar18 = pCVar18 + 1;
    } while (pCVar18 != pCVar4);
    pcVar15 = (char *)&local_88;
    local_88._M_dataplus._M_p._0_1_ = 9;
    lVar10 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar15,lVar10);
  bVar7 = BamAlignment::IsPaired(a);
  if (bVar7) {
    iVar2 = a->MateRefID;
    lVar10 = (long)iVar2;
    if ((-1 < lVar10) &&
       (pRVar3 = (local_68->m_references).
                 super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                 super__Vector_impl_data._M_start,
       iVar13 = (int)((ulong)((long)(local_68->m_references).
                                    super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3)
       , SBORROW4(iVar2,iVar13 * -0x33333333) != iVar2 + iVar13 * 0x33333333 < 0)) {
      if (iVar2 == a->RefID) {
        pcVar15 = "=\t";
        lVar10 = 2;
        poVar9 = this_00;
      }
      else {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (this_00,pRVar3[lVar10].RefName._M_dataplus._M_p,
                            pRVar3[lVar10].RefName._M_string_length);
        pcVar15 = (char *)&local_88;
        local_88._M_dataplus._M_p._0_1_ = 9;
        lVar10 = 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,lVar10);
      poVar9 = (ostream *)std::ostream::operator<<(this_00,a->MatePosition + 1);
      local_88._M_dataplus._M_p._0_1_ = 9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_88,1);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,a->InsertSize);
      local_88._M_dataplus._M_p._0_1_ = 9;
      pcVar15 = (char *)&local_88;
      lVar10 = 1;
      goto LAB_0011249d;
    }
  }
  pcVar15 = "*\t0\t0\t";
  lVar10 = 6;
  poVar9 = this_00;
LAB_0011249d:
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,lVar10);
  sVar14 = (a->QueryBases)._M_string_length;
  if (sVar14 == 0) {
    pcVar15 = "*\t";
    lVar10 = 2;
    poVar9 = this_00;
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (this_00,(a->QueryBases)._M_dataplus._M_p,sVar14);
    pcVar15 = (char *)&local_88;
    local_88._M_dataplus._M_p._0_1_ = 9;
    lVar10 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,lVar10);
  sVar14 = (a->Qualities)._M_string_length;
  if ((sVar14 == 0) ||
     (psVar16 = (string *)(a->Qualities)._M_dataplus._M_p,
     *(char *)&(psVar16->_M_dataplus)._M_p == -1)) {
    psVar16 = &local_88;
    local_88._M_dataplus._M_p._0_1_ = 0x2a;
    sVar14 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)psVar16,sVar14);
  local_60 = &a->TagData;
  pcVar15 = (a->TagData)._M_dataplus._M_p;
  uVar5 = (a->TagData)._M_string_length;
  uVar17 = 0;
  local_58 = a;
  do {
    psVar16 = local_60;
    if (uVar5 <= uVar17) break;
    if (uVar5 - uVar17 < 4) {
      pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Incomplete tag data","");
      BadDataException::BadDataException(pBVar12,&local_88);
      __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
    }
    std::__cxx11::string::substr((ulong)&local_88,(ulong)local_60);
    local_a8._M_dataplus._M_p._0_1_ = 9;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_a8,1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_88._M_dataplus._M_p,local_88._M_string_length);
    local_a8._M_dataplus._M_p._0_1_ = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_a8,1);
    if ((local_58->TagData)._M_string_length <= uVar17 + 2) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    }
    bVar1 = (psVar16->_M_dataplus)._M_p[uVar17 + 2];
    lVar10 = uVar17 + 3;
    if (0x52 < bVar1) {
      if (0x65 < bVar1) {
        if (bVar1 == 0x66) {
          if (uVar5 - lVar10 < 4) {
            pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"Incomplete tag data","");
            BadDataException::BadDataException(pBVar12,&local_a8);
            __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
          }
          std::__ostream_insert<char,std::char_traits<char>>(this_00,"f:",2);
          std::ostream::_M_insert<double>((double)*(float *)(pcVar15 + lVar10));
        }
        else {
          if (bVar1 != 0x69) {
            if (bVar1 != 0x73) goto switchD_00112625_caseD_44;
            if (uVar5 - lVar10 < 2) {
              pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Incomplete tag data","");
              BadDataException::BadDataException(pBVar12,&local_a8);
              __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
            }
            std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
            std::ostream::operator<<(this_00,*(short *)(pcVar15 + lVar10));
            goto LAB_001127fb;
          }
          if (uVar5 - lVar10 < 4) {
            pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"Incomplete tag data","");
            BadDataException::BadDataException(pBVar12,&local_a8);
            __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
          }
          std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
          std::ostream::operator<<(this_00,*(int *)(pcVar15 + lVar10));
        }
        goto LAB_00112834;
      }
      if (bVar1 != 0x53) {
        if (bVar1 == 0x5a) goto switchD_00112625_caseD_48;
        if (bVar1 != 99) goto switchD_00112625_caseD_44;
        std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
        std::ostream::operator<<(this_00,(int)pcVar15[lVar10]);
        goto LAB_00112757;
      }
      if (uVar5 - lVar10 < 2) {
        pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Incomplete tag data","");
        BadDataException::BadDataException(pBVar12,&local_a8);
        __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
LAB_001127fb:
      uVar17 = uVar17 + 5;
      goto LAB_00112838;
    }
    switch(bVar1) {
    case 0x41:
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"A:",2);
      local_a8._M_dataplus._M_p._0_1_ = pcVar15[lVar10];
      std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_a8,1);
      goto LAB_00112757;
    case 0x42:
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"B:",2);
      sVar11 = PrintBArrayValues(local_68,pcVar15 + lVar10,uVar5 - lVar10);
      uVar17 = sVar11 + lVar10;
      break;
    case 0x43:
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
      std::ostream::operator<<(this_00,(uint)(byte)pcVar15[lVar10]);
LAB_00112757:
      uVar17 = uVar17 + 4;
      break;
    default:
switchD_00112625_caseD_44:
      pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unknown tag type: ","");
      std::operator+(&local_a8,&local_50,*pcVar15);
      BadDataException::BadDataException(pBVar12,&local_a8);
      __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
    case 0x48:
switchD_00112625_caseD_48:
      local_a8._M_dataplus._M_p._0_1_ = bVar1;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_a8,1);
      local_a8._M_dataplus._M_p._0_1_ = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_a8,1);
      cVar8 = pcVar15[lVar10];
      while (cVar8 != '\0') {
        local_a8._M_dataplus._M_p._0_1_ = cVar8;
        std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_a8,1);
        lVar6 = lVar10 + 1;
        lVar10 = lVar10 + 1;
        cVar8 = pcVar15[lVar6];
      }
      uVar17 = lVar10 + 1;
      break;
    case 0x49:
      if (uVar5 - lVar10 < 4) {
        pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Incomplete tag data","");
        BadDataException::BadDataException(pBVar12,&local_a8);
        __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
LAB_00112834:
      uVar17 = uVar17 + 7;
    }
LAB_00112838:
    if (uVar17 < uVar5) {
      bVar7 = pcVar15[uVar17] != '\0';
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  } while (bVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
  std::ostream::put((char)this_00);
  std::ostream::flush();
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintSam(const BamAlignment& a)
{

    // tab-delimited
    // <QNAME> <FLAG> <RNAME> <POS> <MAPQ> <CIGAR> <MRNM> <MPOS> <ISIZE> <SEQ> <QUAL> [ <TAG>:<VTYPE>:<VALUE> [...] ]

    // write name & alignment flag
    m_out << a.Name << '\t' << a.AlignmentFlag << '\t';

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size())) {
        m_out << m_references[a.RefID].RefName << '\t';
    } else {
        m_out << "*\t";
    }

    // write position & map quality
    m_out << a.Position + 1 << '\t' << a.MapQuality << '\t';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (cigarData.empty()) {
        m_out << "*\t";
    } else {
        std::vector<CigarOp>::const_iterator cigarIter = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << '\t';
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        if (a.MateRefID == a.RefID) {
            m_out << "=\t";
        } else {
            m_out << m_references[a.MateRefID].RefName << '\t';
        }
        m_out << a.MatePosition + 1 << '\t' << a.InsertSize << '\t';
    } else {
        m_out << "*\t0\t0\t";
    }

    // write sequence
    if (a.QueryBases.empty()) {
        m_out << "*\t";
    } else {
        m_out << a.QueryBases << '\t';
    }

    // write qualities
    if (a.Qualities.empty() || (a.Qualities.at(0) == (char)0xFF)) {
        m_out << '*';
    } else {
        m_out << a.Qualities;
    }

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();

    std::size_t index = 0;
    while (index < tagDataLength) {

        // Need at least four bytes for a tag:
        //    two for name
        //    one for type
        //    at least one for value
        if (tagDataLength - index < 4) {
            throw BadDataException("Incomplete tag data");
        }

        // write tag name
        std::string tagName = a.TagData.substr(index, 2);
        m_out << '\t' << tagName << ':';
        index += 2;

        // get data type
        char type = a.TagData.at(index);
        ++index;
        switch (type) {
            case (Constants::BAM_TAG_TYPE_ASCII):
                m_out << "A:" << tagData[index];
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << int(static_cast<int8_t>(tagData[index]));
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_UINT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << int(static_cast<uint8_t>(tagData[index]));
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT16):
                if (tagDataLength - index < sizeof(int16_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackSignedShort(&tagData[index]);
                index += sizeof(int16_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT16):
                if (tagDataLength - index < sizeof(uint16_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackUnsignedShort(&tagData[index]);
                index += sizeof(uint16_t);
                break;

            case (Constants::BAM_TAG_TYPE_INT32):
                if (tagDataLength - index < sizeof(int32_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackSignedInt(&tagData[index]);
                index += sizeof(int32_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT32):
                if (tagDataLength - index < sizeof(uint32_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackUnsignedInt(&tagData[index]);
                index += sizeof(uint32_t);
                break;

            case (Constants::BAM_TAG_TYPE_FLOAT):
                if (tagDataLength - index < sizeof(float)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "f:" << BamTools::UnpackFloat(&tagData[index]);
                index += sizeof(float);
                break;

            case (Constants::BAM_TAG_TYPE_HEX):  // fall-through
            case (Constants::BAM_TAG_TYPE_STRING):
                m_out << type << ':';
                while (tagData[index]) {
                    m_out << tagData[index];
                    ++index;
                }
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_ARRAY):
                m_out << "B:";
                index += PrintBArrayValues(tagData + index, tagDataLength - index);
                break;

            default:
                throw BadDataException(std::string("Unknown tag type: ") + tagData[0]);
        }

        if (index >= tagDataLength || tagData[index] == '\0') {
            break;
        }
    }

    m_out << std::endl;
}